

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Geometry * rw::Geometry::streamRead(Stream *stream)

{
  Triangle *pTVar1;
  MorphTarget *pMVar2;
  FILE *pFVar3;
  bool bVar4;
  int32 iVar5;
  int32 iVar6;
  Geometry *this;
  MaterialList *pMVar7;
  char *pcVar8;
  long lVar9;
  int32 i;
  long lVar10;
  uint32 version;
  uint32 tribuf [2];
  SurfaceProperties surfProps;
  GeoStreamData buf;
  
  bVar4 = findChunk(stream,1,(uint32 *)0x0,&version);
  if (bVar4) {
    Stream::read32(stream,&buf,0x10);
    this = create(buf.numVertices,buf.numTriangles,buf.flags);
    if (this != (Geometry *)0x0) {
      addMorphTargets(this,buf.numMorphTargets + -1);
      if (version < 0x34000) {
        Stream::read32(stream,&surfProps,0xc);
      }
      if ((this->flags >> 0x18 & 1) == 0) {
        if ((this->flags & 8) != 0) {
          (*stream->_vptr_Stream[4])(stream,this->colors,(ulong)(uint)(this->numVertices << 2));
        }
        for (lVar10 = 0; lVar10 < this->numTexCoordSets; lVar10 = lVar10 + 1) {
          Stream::read32(stream,this->texCoords[lVar10],this->numVertices << 3);
        }
        for (lVar10 = 0; lVar10 < this->numTriangles; lVar10 = lVar10 + 1) {
          Stream::read32(stream,tribuf,8);
          pTVar1 = this->triangles;
          *(uint32 *)pTVar1[lVar10].v = tribuf[0] >> 0x10 | tribuf[0] << 0x10;
          *(uint32 *)(pTVar1[lVar10].v + 2) = tribuf[1] >> 0x10 | tribuf[1] << 0x10;
        }
      }
      lVar10 = 0x20;
      for (lVar9 = 0; lVar9 < this->numMorphTargets; lVar9 = lVar9 + 1) {
        pMVar2 = this->morphTargets;
        Stream::read32(stream,(void *)((long)pMVar2 + lVar10 + -0x18),0x10);
        iVar5 = Stream::readI32(stream);
        iVar6 = Stream::readI32(stream);
        if (iVar5 != 0) {
          Stream::read32(stream,*(void **)((long)pMVar2 + lVar10 + -8),this->numVertices * 0xc);
        }
        if (iVar6 != 0) {
          Stream::read32(stream,*(void **)((long)&pMVar2->parent + lVar10),this->numVertices * 0xc);
        }
        lVar10 = lVar10 + 0x28;
      }
      bVar4 = findChunk(stream,8,(uint32 *)0x0,(uint32 *)0x0);
      if (bVar4) {
        if (version < 0x34000) {
          DAT_001458b8 = surfProps.diffuse;
          defaultSurfaceProps._0_4_ = surfProps.ambient;
          defaultSurfaceProps._4_4_ = surfProps.specular;
        }
        pMVar7 = MaterialList::streamRead(stream,&this->matList);
        if (version < 0x34000) {
          defaultSurfaceProps._0_4_ = 1.0;
          defaultSurfaceProps._4_4_ = 1.0;
          DAT_001458b8 = 1.0;
        }
        if ((pMVar7 != (MaterialList *)0x0) &&
           (bVar4 = PluginList::streamRead((PluginList *)&s_plglist,stream,this), bVar4)) {
          return this;
        }
      }
      else {
        tribuf[0] = 0xf;
        tribuf[1] = 0x80000004;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
                ,0xb7);
        pFVar3 = _stderr;
        pcVar8 = dbgsprint(0x80000004,"MATLIST");
        fprintf(pFVar3,"%s\n",pcVar8);
        setError((Error *)tribuf);
      }
      destroy(this);
    }
  }
  else {
    buf.flags = 0xf;
    buf.numTriangles = -0x7ffffffc;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
            ,0x8f);
    pFVar3 = _stderr;
    pcVar8 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar3,"%s\n",pcVar8);
    setError((Error *)&buf);
  }
  return (Geometry *)0x0;
}

Assistant:

Geometry*
Geometry::streamRead(Stream *stream)
{
	uint32 version;
	GeoStreamData buf;
	SurfaceProperties surfProps;
	MaterialList *ret;
	static SurfaceProperties reset = { 1.0f, 1.0f, 1.0f };

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(buf));
	Geometry *geo = Geometry::create(buf.numVertices,
	                                 buf.numTriangles, buf.flags);
	if(geo == nil)
		return nil;
	geo->addMorphTargets(buf.numMorphTargets-1);
	if(version < 0x34000)
		stream->read32(&surfProps, 12);

	if(!(geo->flags & NATIVE)){
		if(geo->flags & PRELIT)
			stream->read8(geo->colors, 4*geo->numVertices);
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			stream->read32(geo->texCoords[i],
				    2*geo->numVertices*4);
		for(int32 i = 0; i < geo->numTriangles; i++){
			uint32 tribuf[2];
			stream->read32(tribuf, 8);
			geo->triangles[i].v[0]  = tribuf[0] >> 16;
			geo->triangles[i].v[1]  = tribuf[0];
			geo->triangles[i].v[2]  = tribuf[1] >> 16;
			geo->triangles[i].matId = tribuf[1];
		}
	}

	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		stream->read32(&m->boundingSphere, 4*4);
		int32 hasVertices = stream->readI32();
		int32 hasNormals = stream->readI32();
		if(hasVertices)
			stream->read32(m->vertices, 3*geo->numVertices*4);
		if(hasNormals)
			stream->read32(m->normals, 3*geo->numVertices*4);
	}

	if(!findChunk(stream, ID_MATLIST, nil, nil)){
		RWERROR((ERR_CHUNK, "MATLIST"));
		goto fail;
	}
	if(version < 0x34000)
		defaultSurfaceProps = surfProps;

	ret = MaterialList::streamRead(stream, &geo->matList);
	if(version < 0x34000)
		defaultSurfaceProps = reset;
	if(ret == nil)
		goto fail;
	if(s_plglist.streamRead(stream, geo))
		return geo;

fail:
	geo->destroy();
	return nil;
}